

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall
FormatTest_U8StringViewLiteral_Test::TestBody(FormatTest_U8StringViewLiteral_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string_view<fmt::v5::char8_t> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
  args;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  AssertHelper local_278;
  undefined8 local_270;
  basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
  local_268;
  internal local_248 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  u8string_view local_238;
  long local_228;
  undefined8 local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [15];
  
  local_268._M_dataplus._M_p = (pointer)0x2;
  local_278.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_238,"s.size()","2u",(unsigned_long *)&local_268,(uint *)&local_278);
  if (local_238.super_basic_string_view<fmt::v5::char8_t>.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_268);
    if ((undefined8 *)local_238.super_basic_string_view<fmt::v5::char8_t>.size_ == (undefined8 *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_238.super_basic_string_view<fmt::v5::char8_t>.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x99e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_278,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    if (local_268._M_dataplus._M_p != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_268._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(undefined8 *)local_268._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_238.super_basic_string_view<fmt::v5::char8_t>.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_268._M_dataplus._M_p._0_1_ = 0x61;
  testing::internal::CmpHelperEQ<fmt::v5::char8_t,char>
            ((internal *)&local_238,"data[0]","\'a\'",(char8_t *)0x235c94,(char *)&local_268);
  if (local_238.super_basic_string_view<fmt::v5::char8_t>.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_268);
    if ((undefined8 *)local_238.super_basic_string_view<fmt::v5::char8_t>.size_ == (undefined8 *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_238.super_basic_string_view<fmt::v5::char8_t>.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x9a0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_278,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    if (local_268._M_dataplus._M_p != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_268._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(undefined8 *)local_268._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_238.super_basic_string_view<fmt::v5::char8_t>.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_268._M_dataplus._M_p._0_1_ = 0x62;
  testing::internal::CmpHelperEQ<fmt::v5::char8_t,char>
            ((internal *)&local_238,"data[1]","\'b\'",(char8_t *)0x235c95,(char *)&local_268);
  if (local_238.super_basic_string_view<fmt::v5::char8_t>.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_268);
    if ((undefined8 *)local_238.super_basic_string_view<fmt::v5::char8_t>.size_ == (undefined8 *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_238.super_basic_string_view<fmt::v5::char8_t>.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x9a1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_278,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    if (local_268._M_dataplus._M_p != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_268._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(undefined8 *)local_268._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_238.super_basic_string_view<fmt::v5::char8_t>.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_278.data_ = (AssertHelperData *)anon_var_dwarf_3f3a6;
  local_270 = 4;
  local_228 = 0;
  local_238.super_basic_string_view<fmt::v5::char8_t>.data_ = (char8_t *)&PTR_grow_002a4110;
  local_220 = 500;
  format_str.size_ = 6;
  format_str.data_ = (char8_t *)"{:*^5}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
        *)&local_278;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>,fmt::v5::u8string_view>
                ::TYPES;
  local_238.super_basic_string_view<fmt::v5::char8_t>.size_ = (size_t)local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>,fmt::v5::char8_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>
            ((range)&local_238,format_str,args,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::
  basic_string<fmt::v5::char8_t,std::char_traits<fmt::v5::char8_t>,std::allocator<fmt::v5::char8_t>>
  ::_M_construct<fmt::v5::char8_t_const*>
            ((basic_string<fmt::v5::char8_t,std::char_traits<fmt::v5::char8_t>,std::allocator<fmt::v5::char8_t>>
              *)&local_268,local_238.super_basic_string_view<fmt::v5::char8_t>.size_,
             (long)&((_Alloc_hider *)local_238.super_basic_string_view<fmt::v5::char8_t>.size_)->
                    _M_p + local_228);
  local_238.super_basic_string_view<fmt::v5::char8_t>.data_ = (char8_t *)&PTR_grow_002a4110;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_238.super_basic_string_view<fmt::v5::char8_t>.size_ != local_218) {
    operator_delete((void *)local_238.super_basic_string_view<fmt::v5::char8_t>.size_);
  }
  local_238.super_basic_string_view<fmt::v5::char8_t>.data_ = (char8_t *)anon_var_dwarf_3f3b3;
  local_238.super_basic_string_view<fmt::v5::char8_t>.size_ = 8;
  testing::internal::
  CmpHelperEQ<std::__cxx11::basic_string<fmt::v5::char8_t,std::char_traits<fmt::v5::char8_t>,std::allocator<fmt::v5::char8_t>>,fmt::v5::u8string_view>
            (local_248,anon_var_dwarf_3f37f,anon_var_dwarf_3f38c,&local_268,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_248[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_240.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_240.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x9a2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.super_basic_string_view<fmt::v5::char8_t>.data_ != (char8_t *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_238.super_basic_string_view<fmt::v5::char8_t>.data_ != (char8_t *)0x0))
      {
        (**(code **)(*(undefined8 *)local_238.super_basic_string_view<fmt::v5::char8_t>.data_ + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatTest, U8StringViewLiteral) {
  using namespace fmt::literals;
  fmt::u8string_view s = "ab"_u;
  EXPECT_EQ(s.size(), 2u);
  const fmt::char8_t *data = s.data();
  EXPECT_EQ(data[0], 'a');
  EXPECT_EQ(data[1], 'b');
  EXPECT_EQ(format("{:*^5}"_u, "🤡"_u), "**🤡**"_u);
}